

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFace(Parser *this,Face *out)

{
  uint32_t *puVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  char *szWarn;
  long lVar9;
  uint32_t uVar10;
  
  for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  this->filePtr = (char *)pbVar3;
  bVar5 = *pbVar3;
  if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
    szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL [#1]";
LAB_00396bcc:
    LogWarning(this,szWarn);
    SkipToNextToken(this);
    return;
  }
  uVar8 = 0;
  if (0xf5 < (byte)(bVar5 - 0x3a)) {
    uVar8 = 0;
    do {
      uVar8 = (uint)(byte)(bVar5 - 0x30) + uVar8 * 10;
      bVar5 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while (0xf5 < (byte)(bVar5 - 0x3a));
  }
  this->filePtr = (char *)pbVar3;
  out->iFace = uVar8;
  for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  this->filePtr = (char *)pbVar3;
  uVar7 = (ulong)*pbVar3;
  if (uVar7 < 0x3b) {
    if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
LAB_00396c44:
      szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]";
      goto LAB_00396bcc;
    }
    if (uVar7 == 0x3a) {
      this->filePtr = (char *)(pbVar3 + 1);
    }
  }
  iVar2 = 0;
  do {
    for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    bVar5 = *pbVar3;
    uVar7 = (ulong)(bVar5 - 0x41);
    if (0x22 < bVar5 - 0x41) {
LAB_00396da6:
      if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
        szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL";
      }
      else {
        szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. A,B or C expected [#3]";
      }
      goto LAB_00396bcc;
    }
    if ((0x100000001U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x200000002U >> (uVar7 & 0x3f) & 1) == 0) {
        if ((0x400000004U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00396da6;
        lVar9 = 2;
      }
      else {
        lVar9 = 1;
      }
    }
    else {
      lVar9 = 0;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
    for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    if (*pbVar3 != 0x3a) goto LAB_00396c44;
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
    for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    bVar5 = *pbVar3;
    if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
      szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. Vertex index ecpected [#4]";
      goto LAB_00396bcc;
    }
    uVar10 = 0;
    if (0xf5 < (byte)(bVar5 - 0x3a)) {
      uVar10 = 0;
      do {
        uVar10 = (uint)(byte)(bVar5 - 0x30) + uVar10 * 10;
        bVar5 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
      } while (0xf5 < (byte)(bVar5 - 0x3a));
    }
    this->filePtr = (char *)pbVar3;
    (out->super_FaceWithSmoothingGroup).mIndices[lVar9] = uVar10;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  pbVar3 = (byte *)this->filePtr;
  do {
    uVar7 = (ulong)*pbVar3;
    if (uVar7 < 0x2b) {
      if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar7 == 0x2a) break;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
  } while( true );
  iVar2 = strncmp("*MESH_SMOOTHING",(char *)pbVar3,0xf);
  bVar5 = 0x2a;
  if (iVar2 == 0) {
    bVar6 = pbVar3[0xf];
    if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
      pbVar4 = pbVar3 + 0xf;
      pbVar3 = pbVar3 + 0x10;
      if (bVar6 == 0) {
        pbVar3 = pbVar4;
      }
      this->filePtr = (char *)pbVar3;
      for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
      }
      this->filePtr = (char *)pbVar3;
      bVar5 = *pbVar3;
      if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
        szWarn = 
        "Unable to parse *MESH_SMOOTHING Element: Unexpected EOL. Smoothing group(s) expected [#5]";
        goto LAB_00396bcc;
      }
      while( true ) {
        if ((byte)(bVar5 - 0x30) < 9) {
          bVar6 = 0;
          do {
            bVar6 = (bVar5 - 0x30) + bVar6 * '\n';
            bVar5 = pbVar3[1];
            pbVar3 = pbVar3 + 1;
          } while (0xf5 < (byte)(bVar5 - 0x3a));
          this->filePtr = (char *)pbVar3;
          puVar1 = &(out->super_FaceWithSmoothingGroup).iSmoothGroup;
          *puVar1 = *puVar1 | 1 << (bVar6 & 0x1f);
          pbVar3 = (byte *)this->filePtr;
        }
        for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
        }
        this->filePtr = (char *)pbVar3;
        bVar5 = *pbVar3;
        if (bVar5 != 0x2c) break;
        pbVar3 = pbVar3 + 1;
        this->filePtr = (char *)pbVar3;
        for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
        }
        this->filePtr = (char *)pbVar3;
        bVar5 = *pbVar3;
      }
    }
  }
  pbVar3 = pbVar3 + 0xb;
  do {
    if (bVar5 < 0x2b) {
      if ((0x3401UL >> ((ulong)bVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if ((ulong)bVar5 == 0x2a) break;
    }
    this->filePtr = (char *)(pbVar3 + -10);
    bVar5 = pbVar3[-10];
    pbVar3 = pbVar3 + 1;
  } while( true );
  iVar2 = strncmp("*MESH_MTLID",(char *)(pbVar3 + -0xb),0xb);
  if (iVar2 == 0) {
    bVar5 = *pbVar3;
    if (((ulong)bVar5 < 0x21) && ((0x100003601U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
      pbVar4 = pbVar3 + 1;
      if (bVar5 == 0) {
        pbVar4 = pbVar3;
      }
      this->filePtr = (char *)pbVar4;
      for (; (*pbVar4 == 0x20 || (*pbVar4 == 9)); pbVar4 = pbVar4 + 1) {
      }
      this->filePtr = (char *)pbVar4;
      bVar5 = *pbVar4;
      if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
        szWarn = "Unable to parse *MESH_MTLID Element: Unexpected EOL. Material index expected [#6]"
        ;
        goto LAB_00396bcc;
      }
      uVar8 = 0;
      if (0xf5 < (byte)(bVar5 - 0x3a)) {
        uVar8 = 0;
        do {
          uVar8 = (uint)(byte)(bVar5 - 0x30) + uVar8 * 10;
          bVar5 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        } while (0xf5 < (byte)(bVar5 - 0x3a));
      }
      this->filePtr = (char *)pbVar4;
      out->iMaterial = uVar8;
    }
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFace(ASE::Face& out)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL [#1]");
        SkipToNextToken();
        return;
    }

    // parse the face index
    out.iFace = strtoul10(filePtr,&filePtr);

    // next character should be ':'
    if(!SkipSpaces(&filePtr))
    {
        // FIX: there are some ASE files which haven't got : here ....
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]");
        SkipToNextToken();
        return;
    }
    // FIX: There are some ASE files which haven't got ':' here
    if(':' == *filePtr)++filePtr;

    // Parse all mesh indices
    for (unsigned int i = 0; i < 3;++i)
    {
        unsigned int iIndex = 0;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL");
            SkipToNextToken();
            return;
        }
        switch (*filePtr)
        {
        case 'A':
        case 'a':
            break;
        case 'B':
        case 'b':
            iIndex = 1;
            break;
        case 'C':
        case 'c':
            iIndex = 2;
            break;
        default:
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "A,B or C expected [#3]");
            SkipToNextToken();
            return;
        };
        ++filePtr;

        // next character should be ':'
        if(!SkipSpaces(&filePtr) || ':' != *filePtr)
        {
            LogWarning("Unable to parse *MESH_FACE Element: "
                "Unexpected EOL. \':\' expected [#2]");
            SkipToNextToken();
            return;
        }

        ++filePtr;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "Vertex index ecpected [#4]");
            SkipToNextToken();
            return;
        }
        out.mIndices[iIndex] = strtoul10(filePtr,&filePtr);
    }

    // now we need to skip the AB, BC, CA blocks.
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            //iLineNumber++;
            return;
        }
        filePtr++;
    }

    // parse the smoothing group of the face
    if (TokenMatch(filePtr,"*MESH_SMOOTHING",15))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_SMOOTHING Element: "
                "Unexpected EOL. Smoothing group(s) expected [#5]");
            SkipToNextToken();
            return;
        }

        // Parse smoothing groups until we don't anymore see commas
        // FIX: There needn't always be a value, sad but true
        while (true)
        {
            if (*filePtr < '9' && *filePtr >= '0')
            {
                out.iSmoothGroup |= (1 << strtoul10(filePtr,&filePtr));
            }
            SkipSpaces(&filePtr);
            if (',' != *filePtr)
            {
                break;
            }
            ++filePtr;
            SkipSpaces(&filePtr);
        }
    }

    // *MESH_MTLID  is optional, too
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            return;
        }
        filePtr++;
    }

    if (TokenMatch(filePtr,"*MESH_MTLID",11))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_MTLID Element: Unexpected EOL. "
                "Material index expected [#6]");
            SkipToNextToken();
            return;
        }
        out.iMaterial = strtoul10(filePtr,&filePtr);
    }
    return;
}